

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragDepthTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::FragDepthWriteCase::iterate(FragDepthWriteCase *this)

{
  RenderContext *pRVar1;
  code *pcVar2;
  void *pvVar3;
  FragDepthWriteCase *pFVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 uVar8;
  uint uVar9;
  undefined4 extraout_var;
  int *piVar10;
  NotSupportedError *this_00;
  TestError *pTVar11;
  char *description;
  long lVar12;
  int height;
  int iVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  float fVar15;
  float position [16];
  Surface referenceFrame;
  Surface renderedFrame;
  float coord [8];
  ProgramSources sources;
  ShaderProgram program;
  Random rnd;
  undefined1 local_310 [8];
  void *local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  int local_2e8;
  long local_2e0;
  FragDepthWriteCase *local_2d8;
  uint local_2d0;
  uint local_2cc;
  undefined1 local_2c8 [8];
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2b8;
  undefined4 local_2a8;
  undefined4 uStack_2a4;
  float fStack_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined8 uStack_290;
  TestLog *local_280;
  Surface local_278;
  Surface local_260;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  undefined1 local_228 [8];
  _Alloc_hider local_220;
  pointer local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  int local_200;
  VertexComponentType local_1f8;
  VertexComponentConversion VStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  int local_1e8;
  value_type *local_1e0;
  PrimitiveType local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  pointer pbStack_1a0;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_198;
  undefined1 local_178 [40];
  long *local_150;
  long local_148;
  long local_140 [2];
  long *local_130;
  long local_128;
  long local_120 [2];
  undefined1 local_110 [152];
  deUint32 local_78;
  bool local_50;
  deRandom local_40;
  undefined4 extraout_var_00;
  
  local_280 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_2e0 = CONCAT44(extraout_var,iVar6);
  dVar7 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&local_40,dVar7);
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  piVar10 = (int *)CONCAT44(extraout_var_00,iVar6);
  iVar6 = *piVar10;
  iVar13 = 0x80;
  if (iVar6 < 0x80) {
    iVar13 = iVar6;
  }
  height = 0x80;
  if (piVar10[1] < 0x80) {
    height = piVar10[1];
  }
  dVar7 = deRandom_getUint32(&local_40);
  local_2cc = dVar7 % ((iVar6 - iVar13) + 1U);
  iVar6 = piVar10[1];
  dVar7 = deRandom_getUint32(&local_40);
  local_2d0 = dVar7 % ((iVar6 - height) + 1U);
  tcu::Surface::Surface(&local_260,iVar13,height);
  tcu::Surface::Surface(&local_278,iVar13,height);
  lVar12 = local_2e0;
  if (piVar10[6] == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Depth buffer is required","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
               ,0x136);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(local_2e0 + 0x1a00))(local_2cc,local_2d0,iVar13,height);
  (**(code **)(lVar12 + 0x188))(0x4500);
  (**(code **)(lVar12 + 0x5e0))(0xb71);
  (**(code **)(lVar12 + 0x4a0))(0x201);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_2c8 = (undefined1  [8])&aStack_2b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2c8,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec2 a_coord;\nout highp vec2 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,"");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_310,(this->m_fragSrc)._M_dataplus._M_p,(allocator<char> *)local_248);
  local_178[0x10] = 0;
  local_178._17_8_ = 0;
  local_178._0_8_ = (pointer)0x0;
  local_178[8] = 0;
  local_178._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_228,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_228,(value_type *)local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_210,(value_type *)local_310);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_110,pRVar1,(ProgramSources *)local_228);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_178);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_198);
  lVar12 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_228 + lVar12));
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != -0x18);
  if (local_310 != (undefined1  [8])&local_300) {
    operator_delete((void *)local_310,local_300._M_allocated_capacity + 1);
  }
  lVar12 = local_2e0;
  if (local_2c8 != (undefined1  [8])&aStack_2b8) {
    operator_delete((void *)local_2c8,
                    CONCAT44(aStack_2b8._M_allocated_capacity._4_4_,
                             aStack_2b8._M_allocated_capacity._0_4_) + 1);
  }
  glu::operator<<(local_280,(ShaderProgram *)local_110);
  if (local_50 != false) {
    local_238._M_allocated_capacity = 0x3f800000;
    local_238._8_8_ = &DAT_3f8000003f800000;
    local_248 = (undefined1  [8])0x0;
    uStack_240 = 0x3f80000000000000;
    uStack_298 = 0x3f800000;
    uStack_294 = 0x3f800000;
    uStack_290 = 0x3f800000bf800000;
    local_2a8 = 0x3f800000;
    uStack_2a4 = 0xbf800000;
    fStack_2a0 = 0.0;
    uStack_29c = 0x3f800000;
    aStack_2b8._M_allocated_capacity._0_4_ = 0xbf800000;
    aStack_2b8._M_allocated_capacity._4_4_ = 0x3f800000;
    aStack_2b8._8_4_ = 0;
    aStack_2b8._12_4_ = 0x3f800000;
    local_2c8 = (undefined1  [8])0xbf800000bf800000;
    uStack_2c0 = 1.0;
    uStack_2bc = 0x3f800000;
    (**(code **)(lVar12 + 0x1680))(local_78);
    pcVar2 = *(code **)(local_2e0 + 0x15a0);
    uVar8 = (**(code **)(local_2e0 + 0xb48))(local_78,"u_color");
    (*pcVar2)(0,0x3f800000,0,0x3f800000,uVar8);
    deqp::gls::setupDefaultUniforms(((this->super_TestCase).m_context)->m_renderCtx,local_78);
    local_2d8 = this;
    local_130 = local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"a_position","");
    local_310._0_4_ = 1;
    pvVar3 = (void *)((long)&local_300 + 8);
    local_308 = pvVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_308,local_130,local_128 + (long)local_130);
    local_2e8 = 0;
    local_228._0_4_ = local_310._0_4_;
    local_220._M_p = (pointer)&local_210;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_220,local_308,(long)local_308 + local_300._M_allocated_capacity);
    local_200 = local_2e8;
    local_1f8 = VTX_COMP_FLOAT;
    VStack_1f4 = VTX_COMP_CONVERT_NONE;
    iStack_1f0 = 4;
    iStack_1ec = 4;
    local_1e8 = 0;
    local_1e0 = (value_type *)local_2c8;
    if (local_308 != pvVar3) {
      operator_delete(local_308,local_300._8_8_ + 1);
    }
    local_150 = local_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"a_coord","");
    local_310._0_4_ = 1;
    local_308 = pvVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_308,local_150,local_148 + (long)local_150);
    local_2e8 = 0;
    local_1d8 = local_310._0_4_;
    pbVar14 = &local_1c0;
    local_1d0[0] = pbVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d0,local_308,(long)local_308 + local_300._M_allocated_capacity);
    local_1c0.field_2._M_allocated_capacity._0_4_ = local_2e8;
    local_1c0.field_2._8_8_ = (pointer)0x8;
    pbStack_1a0 = (pointer)0x400000002;
    local_198.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    local_198.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_248;
    if (local_308 != pvVar3) {
      operator_delete(local_308,local_300._8_8_ + 1);
    }
    pFVar4 = local_2d8;
    if (local_150 != local_140) {
      operator_delete(local_150,local_140[0] + 1);
    }
    if (local_130 != local_120) {
      operator_delete(local_130,local_120[0] + 1);
    }
    local_310 = (undefined1  [8])0x600000000;
    local_308 = (void *)CONCAT44(local_308._4_4_,1);
    local_300._M_allocated_capacity = (size_type)iterate::quadIndices;
    glu::draw(((pFVar4->super_TestCase).m_context)->m_renderCtx,local_78,2,
              (VertexArrayBinding *)local_228,(PrimitiveList *)local_310,(DrawUtilCallback *)0x0);
    lVar12 = -0xa0;
    do {
      if (pbVar14 !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          pbVar14[-1].field_2._M_allocated_capacity) {
        operator_delete((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        pbVar14[-1].field_2._M_allocated_capacity,
                        (ulong)((pbVar14->_M_dataplus)._M_p + 1));
      }
      pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &pbVar14[-3].field_2;
      lVar12 = lVar12 + 0x50;
    } while (lVar12 != 0);
    dVar7 = (**(code **)(local_2e0 + 0x800))();
    glu::checkError(dVar7,"Draw test quad",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
                    ,0x166);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_110);
    pRVar1 = ((pFVar4->super_TestCase).m_context)->m_renderCtx;
    local_2c8 = (undefined1  [8])&aStack_2b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2c8,
               "#version 300 es\nin highp vec4 a_position;\nin highp vec2 a_coord;\nout highp vec2 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
               ,"");
    local_310 = (undefined1  [8])&local_300;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_310,
               "#version 300 es\nuniform highp vec4 u_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = u_color;\n}\n"
               ,"");
    local_178[0x10] = 0;
    local_178._17_8_ = 0;
    local_178._0_8_ = (pointer)0x0;
    local_178[8] = 0;
    local_178._9_7_ = 0;
    memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_228,0,0xac);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_228,(value_type *)local_2c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_210,(value_type *)local_310);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_110,pRVar1,(ProgramSources *)local_228)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_178);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_198);
    lVar12 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_228 + lVar12));
      lVar12 = lVar12 + -0x18;
    } while (lVar12 != -0x18);
    if (local_310 != (undefined1  [8])&local_300) {
      operator_delete((void *)local_310,local_300._M_allocated_capacity + 1);
    }
    lVar12 = local_2e0;
    if (local_2c8 != (undefined1  [8])&aStack_2b8) {
      operator_delete((void *)local_2c8,
                      CONCAT44(aStack_2b8._M_allocated_capacity._4_4_,
                               aStack_2b8._M_allocated_capacity._0_4_) + 1);
    }
    if (local_50 != false) {
      iVar6 = (**(code **)(lVar12 + 0x780))(local_78,"a_position");
      uVar8 = (**(code **)(lVar12 + 0xb48))(local_78,"u_color");
      (**(code **)(lVar12 + 0x1680))(local_78);
      (**(code **)(lVar12 + 0x4a8))(0);
      iVar13 = 0;
      do {
        local_248._4_4_ = (float)iVar13 * 0.06666667;
        local_248._0_4_ = local_248._4_4_;
        uStack_2c0 = (float)local_248._4_4_ + (float)local_248._4_4_ + -1.0;
        uStack_240 = CONCAT44(0x3f800000,local_248._4_4_);
        local_2c8 = (undefined1  [8])0xbf800000bf800000;
        uStack_2bc = 0x3f800000;
        aStack_2b8._M_allocated_capacity._0_4_ = 0xbf800000;
        aStack_2b8._M_allocated_capacity._4_4_ = 0x3f800000;
        aStack_2b8._12_4_ = 0x3f800000;
        local_2a8 = 0x3f800000;
        uStack_2a4 = 0xbf800000;
        uStack_29c = 0x3f800000;
        uStack_298 = 0x3f800000;
        uStack_294 = 0x3f800000;
        uStack_290 = CONCAT44(0x3f800000,uStack_2c0);
        local_228 = (undefined1  [8])((ulong)local_228 & 0xffffffff00000000);
        local_220._M_p = (pointer)&local_210;
        local_218 = (pointer)0x0;
        local_210._M_local_buf[0] = '\0';
        local_1f8 = VTX_COMP_FLOAT;
        VStack_1f4 = VTX_COMP_CONVERT_NONE;
        iStack_1f0 = 4;
        iStack_1ec = 4;
        local_1e8 = 0;
        local_1e0 = (value_type *)local_2c8;
        aStack_2b8._8_4_ = uStack_2c0;
        fStack_2a0 = uStack_2c0;
        local_200 = iVar6;
        (**(code **)(lVar12 + 0x15a8))(uVar8,1,local_248);
        local_310 = (undefined1  [8])0x600000000;
        local_308 = (void *)CONCAT44(local_308._4_4_,1);
        local_300._M_allocated_capacity = (size_type)iterate::quadIndices;
        glu::draw(((local_2d8->super_TestCase).m_context)->m_renderCtx,local_78,1,
                  (VertexArrayBinding *)local_228,(PrimitiveList *)local_310,(DrawUtilCallback *)0x0
                 );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_p != &local_210) {
          operator_delete(local_220._M_p,
                          CONCAT71(local_210._M_allocated_capacity._1_7_,local_210._M_local_buf[0])
                          + 1);
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 != 0x10);
      dVar7 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar7,"Visualization draw",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
                      ,0x18c);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_110);
      pRVar1 = ((local_2d8->super_TestCase).m_context)->m_renderCtx;
      local_228._0_4_ = RGBA;
      local_228._4_4_ = UNORM_INT8;
      if ((void *)local_260.m_pixels.m_cap != (void *)0x0) {
        local_260.m_pixels.m_cap = (size_t)local_260.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_110,(TextureFormat *)local_228,local_260.m_width,
                 local_260.m_height,1,(void *)local_260.m_pixels.m_cap);
      glu::readPixels(pRVar1,local_2cc,local_2d0,(PixelBufferAccess *)local_110);
      if (0 < local_278.m_height) {
        iVar6 = 0;
        do {
          if (0 < local_278.m_width) {
            iVar13 = 0;
            do {
              local_110._0_4_ = ((float)iVar13 + 0.5) / (float)local_278.m_width;
              local_110._4_4_ = ((float)iVar6 + 0.5) / (float)local_278.m_height;
              fVar15 = (*local_2d8->m_evalFunc)((Vec2 *)local_110);
              fVar15 = floorf(fVar15 / 0.06666667);
              fVar15 = (float)(int)fVar15 * 0.06666667 * 255.0;
              uVar9 = (uint)(fVar15 + *(float *)(&DAT_00b4939c + (ulong)(fVar15 < 0.0) * 4));
              if (0xfe < (int)uVar9) {
                uVar9 = 0xff;
              }
              if ((int)uVar9 < 1) {
                uVar9 = 0;
              }
              *(uint *)((long)local_278.m_pixels.m_ptr +
                       (long)(local_278.m_width * iVar6 + iVar13) * 4) =
                   uVar9 << 0x10 | uVar9 << 8 | uVar9 | 0xff000000;
              iVar13 = iVar13 + 1;
            } while (iVar13 < local_278.m_width);
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 < local_278.m_height);
      }
      bVar5 = tcu::fuzzyCompare(local_280,"Result","Image comparison result",&local_278,&local_260,
                                0.05,COMPARE_LOG_RESULT);
      description = "Fail";
      if (bVar5) {
        description = "Pass";
      }
      tcu::TestContext::setTestResult
                ((local_2d8->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar5,
                 description);
      tcu::Surface::~Surface(&local_278);
      tcu::Surface::~Surface(&local_260);
      return STOP;
    }
    glu::operator<<(local_280,(ShaderProgram *)local_110);
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar11,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
               ,0x16f);
    __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar11,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragDepthTests.cpp"
             ,0x145);
  __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

FragDepthWriteCase::IterateResult FragDepthWriteCase::iterate (void)
{
	TestLog&					log				= m_testCtx.getLog();
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	de::Random					rnd				(deStringHash(getName()));
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderContext().getRenderTarget();
	int							viewportW		= de::min(128, renderTarget.getWidth());
	int							viewportH		= de::min(128, renderTarget.getHeight());
	int							viewportX		= rnd.getInt(0, renderTarget.getWidth()-viewportW);
	int							viewportY		= rnd.getInt(0, renderTarget.getHeight()-viewportH);
	tcu::Surface				renderedFrame	(viewportW, viewportH);
	tcu::Surface				referenceFrame	(viewportW, viewportH);
	const int					numDepthSteps	= 16;
	const float					depthStep		= 1.0f/(float)(numDepthSteps-1);

	if (renderTarget.getDepthBits() == 0)
		throw tcu::NotSupportedError("Depth buffer is required", "", __FILE__, __LINE__);

	gl.viewport(viewportX, viewportY, viewportW, viewportH);
	gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	gl.enable(GL_DEPTH_TEST);
	gl.depthFunc(GL_LESS);

	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	// Render with given shader.
	{
		glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(s_vertexShaderSrc, m_fragSrc.c_str()));
		log << program;

		if (!program.isOk())
			TCU_FAIL("Compile failed");

		const float coord[] =
		{
			0.0f, 0.0f,
			0.0f, 1.0f,
			1.0f, 0.0f,
			1.0f, 1.0f
		};
		const float position[] =
		{
			-1.0f, -1.0f, +1.0f, 1.0f,
			-1.0f, +1.0f,  0.0f, 1.0f,
			+1.0f, -1.0f,  0.0f, 1.0f,
			+1.0f, +1.0f, -1.0f, 1.0f
		};

		gl.useProgram(program.getProgram());
		gl.uniform4f(gl.getUniformLocation(program.getProgram(), "u_color"), 0.0f, 1.0f, 0.0f, 1.0f);

		// Setup default helper uniforms.
		gls::setupDefaultUniforms(m_context.getRenderContext(), program.getProgram());

		{
			glu::VertexArrayBinding vertexArrays[] =
			{
				glu::va::Float("a_position",	4, 4, 0, &position[0]),
				glu::va::Float("a_coord",		2, 4, 0, &coord[0])
			};
			glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw test quad");
	}

	// Visualize by rendering full-screen quads with increasing depth and color.
	{
		glu::ShaderProgram program (m_context.getRenderContext(), glu::makeVtxFragSources(s_vertexShaderSrc, s_defaultFragmentShaderSrc));
		if (!program.isOk())
		{
			log << program;
			TCU_FAIL("Compile failed");
		}

		int posLoc		= gl.getAttribLocation(program.getProgram(), "a_position");
		int colorLoc	= gl.getUniformLocation(program.getProgram(), "u_color");

		gl.useProgram(program.getProgram());
		gl.depthMask(GL_FALSE);

		for (int stepNdx = 0; stepNdx < numDepthSteps; stepNdx++)
		{
			float	f		= (float)stepNdx*depthStep;
			float	depth	= f*2.0f - 1.0f;
			Vec4	color	= Vec4(f, f, f, 1.0f);

			const float position[] =
			{
				-1.0f, -1.0f, depth, 1.0f,
				-1.0f, +1.0f, depth, 1.0f,
				+1.0f, -1.0f, depth, 1.0f,
				+1.0f, +1.0f, depth, 1.0f
			};
			glu::VertexArrayBinding	posBinding = glu::va::Float(posLoc, 4, 4, 0, &position[0]);

			gl.uniform4fv(colorLoc, 1, color.getPtr());
			glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Visualization draw");
	}

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedFrame.getAccess());

	// Render reference.
	for (int y = 0; y < referenceFrame.getHeight(); y++)
	{
		for (int x = 0; x < referenceFrame.getWidth(); x++)
		{
			float	xf		= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float	yf		= ((float)y + 0.5f) / (float)referenceFrame.getHeight();
			float	d		= m_evalFunc(Vec2(xf, yf));
			int		step	= (int)deFloatFloor(d / depthStep);
			int		col		= de::clamp(deRoundFloatToInt32((float)step*depthStep*255.0f), 0, 255);

			referenceFrame.setPixel(x, y, tcu::RGBA(col, col, col, 0xff));
		}
	}

	bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", referenceFrame, renderedFrame, 0.05f, tcu::COMPARE_LOG_RESULT);
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Fail");
	return STOP;
}